

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O2

int read2Dfield(FILE *in,double **field,size_t offX,size_t offY)

{
  size_t sVar1;
  size_t sVar2;
  size_t size [2];
  
  if (field != (double **)0x0 && in != (FILE *)0x0) {
    sVar1 = fread(size,8,2,(FILE *)in);
    if (sVar1 < 2) {
      return -1;
    }
    sVar2 = 0;
    do {
      if (size[0] == sVar2) {
        return 1;
      }
      sVar1 = fread(field[offX + sVar2] + offY,8,size[1],(FILE *)in);
      sVar2 = sVar2 + 1;
    } while (sVar1 == size[1]);
  }
  return -1;
}

Assistant:

int read2Dfield (FILE *in, REAL **field, size_t offX, size_t offY)
{
	if (!in || !field)
		return -1;
	size_t size[2];
	if (fread(size,sizeof(size_t),2,in) < 2)
		return -1;
	for (size_t k = 0; k < size[0]; k++) /* Loop over lines */
	{
		if (fread(field[k+offX]+offY,sizeof(REAL),size[1],in) != size[1])
			return -1;
	}
	return 1;
}